

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::format_error_code
          (internal *this,buffer<char> *out,int error_code,string_view message)

{
  ulong uVar1;
  size_t sVar2;
  iterator iVar3;
  long lVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  undefined4 in_register_00000014;
  uint value;
  uint uVar8;
  buffer<char> *c;
  writer w;
  basic_writer<duckdb_fmt::v6::buffer_range<char>_> local_30;
  
  pcVar6 = message.data_;
  value = (uint)out;
  *(undefined8 *)(this + 0x10) = 0;
  uVar5 = -value;
  if (0 < (int)value) {
    uVar5 = value;
  }
  uVar8 = 0x1f;
  if ((uVar5 | 1) != 0) {
    for (; (uVar5 | 1) >> uVar8 == 0; uVar8 = uVar8 - 1) {
    }
  }
  uVar8 = (uVar8 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  local_30.locale_.locale_ = (void *)0x0;
  pcVar7 = (char *)(0x1ec - ((((ulong)out & 0xffffffff) >> 0x1f) +
                            (ulong)((uVar8 - (uVar5 < *(uint *)(basic_data<void>::
                                                                zero_or_powers_of_10_32 +
                                                               (ulong)uVar8 * 4))) + 1)));
  local_30.out_.container = (buffer<char> *)this;
  if (pcVar6 <= pcVar7) {
    if (*(char **)(this + 0x18) < pcVar6) {
      (*(code *)**(undefined8 **)this)(this,pcVar6,error_code,pcVar7,message.size_);
    }
    iVar3.container = local_30.out_.container;
    *(char **)(this + 0x10) = pcVar6;
    if (pcVar6 != (char *)0x0) {
      lVar4 = *(long *)(this + 8);
      pcVar7 = (char *)0x0;
      do {
        pcVar7[lVar4] = pcVar7[CONCAT44(in_register_00000014,error_code)];
        pcVar7 = pcVar7 + 1;
      } while (pcVar6 != pcVar7);
    }
    sVar2 = (local_30.out_.container)->size_;
    uVar1 = sVar2 + 2;
    if ((local_30.out_.container)->capacity_ < uVar1) {
      (**(local_30.out_.container)->_vptr_buffer)(local_30.out_.container,uVar1);
    }
    (iVar3.container)->size_ = uVar1;
    pcVar6 = (iVar3.container)->ptr_;
    lVar4 = 0;
    do {
      pcVar6[lVar4 + sVar2] = " : "[lVar4 + 1];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
  }
  iVar3.container = local_30.out_.container;
  sVar2 = (local_30.out_.container)->size_;
  uVar1 = sVar2 + 6;
  if ((local_30.out_.container)->capacity_ < uVar1) {
    (**(local_30.out_.container)->_vptr_buffer)(local_30.out_.container,uVar1);
  }
  (iVar3.container)->size_ = uVar1;
  pcVar6 = (iVar3.container)->ptr_;
  lVar4 = 0;
  do {
    pcVar6[lVar4 + sVar2] = "error "[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  basic_writer<duckdb_fmt::v6::buffer_range<char>_>::write_decimal<int>(&local_30,value);
  return;
}

Assistant:

FMT_FUNC void format_error_code(internal::buffer<char>& out, int error_code,
                                string_view message) FMT_NOEXCEPT {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  std::size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  auto abs_value = static_cast<uint32_or_64_or_128_t<int>>(error_code);
  if (internal::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += internal::to_unsigned(internal::count_digits(abs_value));
  internal::writer w(out);
  if (message.size() <= inline_buffer_size - error_code_size) {
    w.write(message);
    w.write(SEP);
  }
  w.write(ERROR_STR);
  w.write(error_code);
  assert(out.size() <= inline_buffer_size);
}